

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::SetGroupBitField
          (GroupDestinationRecord *this,KUINT8 Group,KBOOL InGroup)

{
  KException *this_00;
  allocator<char> local_39;
  bitset<32UL> bits;
  
  if (Group < 0x20) {
    bits.super__Base_bitset<1UL>._M_w._4_4_ = 0;
    bits.super__Base_bitset<1UL>._M_w._0_4_ = this->m_ui32GrpBtField;
    if (InGroup) {
      std::bitset<32UL>::set(&bits,(ulong)Group,true);
    }
    else {
      std::bitset<32UL>::reset(&bits,(ulong)Group);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&bits,"SetGroupBitField",&local_39);
  KException::KException(this_00,(KString *)&bits,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GroupDestinationRecord::SetGroupBitField(KUINT8 Group, KBOOL InGroup /*= true*/ ) noexcept(false)
{
    if( Group > 31 )throw KException( __FUNCTION__, OUT_OF_BOUNDS );

    bitset<32> bits( ( KINT32 )m_ui32GrpBtField ); // We need to cast to a signed int, this is a visual studio 2010 fix
    InGroup ? bits.set( Group ) : bits.reset( Group );
}